

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enet.h
# Opt level: O0

void enet_peer_dispatch_incoming_unreliable_commands
               (ENetPeer *peer,ENetChannel *channel,ENetIncomingCommand *queuedCommand)

{
  ushort uVar1;
  ushort local_42;
  uint16_t currentWindow;
  uint16_t reliableWindow;
  ENetIncomingCommand *incomingCommand;
  ENetListIterator currentCommand;
  ENetListIterator startCommand;
  ENetListIterator droppedCommand;
  ENetIncomingCommand *queuedCommand_local;
  ENetChannel *channel_local;
  ENetPeer *peer_local;
  
  incomingCommand = (ENetIncomingCommand *)(channel->incomingUnreliableCommands).sentinel.next;
  currentCommand = (ENetListIterator)incomingCommand;
  startCommand = (ENetListIterator)incomingCommand;
  for (; incomingCommand != (ENetIncomingCommand *)&channel->incomingUnreliableCommands;
      incomingCommand = (ENetIncomingCommand *)(incomingCommand->incomingCommandList).next) {
    if (((incomingCommand->command).header.command & 0xf) != 9) {
      if (incomingCommand->reliableSequenceNumber == channel->incomingReliableSequenceNumber) {
        if (incomingCommand->fragmentsRemaining == 0) {
          channel->incomingUnreliableSequenceNumber = incomingCommand->unreliableSequenceNumber;
          goto LAB_00106348;
        }
        if ((ENetIncomingCommand *)currentCommand == incomingCommand) {
          if ((ENetIncomingCommand *)startCommand != incomingCommand) {
            startCommand = (incomingCommand->incomingCommandList).previous;
          }
        }
        else {
          enet_list_move(&(peer->dispatchedCommands).sentinel,currentCommand,
                         (incomingCommand->incomingCommandList).previous);
          if (peer->needsDispatch == 0) {
            enet_list_insert(&(peer->host->dispatchQueue).sentinel,peer);
            peer->needsDispatch = 1;
          }
          startCommand = &incomingCommand->incomingCommandList;
        }
      }
      else {
        local_42 = incomingCommand->reliableSequenceNumber / 0x1000;
        uVar1 = channel->incomingReliableSequenceNumber / 0x1000;
        if (incomingCommand->reliableSequenceNumber < channel->incomingReliableSequenceNumber) {
          local_42 = local_42 + 0x10;
        }
        if ((uVar1 <= local_42) && (local_42 < (ushort)(uVar1 + 7))) break;
        startCommand = (incomingCommand->incomingCommandList).next;
        if (((ENetIncomingCommand *)currentCommand != incomingCommand) &&
           (enet_list_move(&(peer->dispatchedCommands).sentinel,currentCommand,
                           (incomingCommand->incomingCommandList).previous),
           peer->needsDispatch == 0)) {
          enet_list_insert(&(peer->host->dispatchQueue).sentinel,peer);
          peer->needsDispatch = 1;
        }
      }
      currentCommand = (incomingCommand->incomingCommandList).next;
    }
LAB_00106348:
  }
  if ((ENetIncomingCommand *)currentCommand != incomingCommand) {
    enet_list_move(&(peer->dispatchedCommands).sentinel,currentCommand,
                   (incomingCommand->incomingCommandList).previous);
    if (peer->needsDispatch == 0) {
      enet_list_insert(&(peer->host->dispatchQueue).sentinel,peer);
      peer->needsDispatch = 1;
    }
    startCommand = &incomingCommand->incomingCommandList;
  }
  enet_peer_remove_incoming_commands
            (&channel->incomingUnreliableCommands,
             (channel->incomingUnreliableCommands).sentinel.next,startCommand,queuedCommand);
  return;
}

Assistant:

void enet_peer_dispatch_incoming_unreliable_commands(ENetPeer* peer, ENetChannel* channel, ENetIncomingCommand* queuedCommand) {
	ENetListIterator droppedCommand, startCommand, currentCommand;

	for (droppedCommand = startCommand = currentCommand = enet_list_begin(&channel->incomingUnreliableCommands); currentCommand != enet_list_end(&channel->incomingUnreliableCommands); currentCommand = enet_list_next(currentCommand)) {
		ENetIncomingCommand* incomingCommand = (ENetIncomingCommand*)currentCommand;

		if ((incomingCommand->command.header.command & ENET_PROTOCOL_COMMAND_MASK) == ENET_PROTOCOL_COMMAND_SEND_UNSEQUENCED)
			continue;

		if (incomingCommand->reliableSequenceNumber == channel->incomingReliableSequenceNumber) {
			if (incomingCommand->fragmentsRemaining <= 0) {
				channel->incomingUnreliableSequenceNumber = incomingCommand->unreliableSequenceNumber;

				continue;
			}

			if (startCommand != currentCommand) {
				enet_list_move(enet_list_end(&peer->dispatchedCommands), startCommand, enet_list_previous(currentCommand));

				if (!peer->needsDispatch) {
					enet_list_insert(enet_list_end(&peer->host->dispatchQueue), &peer->dispatchList);

					peer->needsDispatch = 1;
				}

				droppedCommand = currentCommand;
			}
			else if (droppedCommand != currentCommand) {
				droppedCommand = enet_list_previous(currentCommand);
			}
		}
		else {
			uint16_t reliableWindow = incomingCommand->reliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;
			uint16_t currentWindow = channel->incomingReliableSequenceNumber / ENET_PEER_RELIABLE_WINDOW_SIZE;

			if (incomingCommand->reliableSequenceNumber < channel->incomingReliableSequenceNumber)
				reliableWindow += ENET_PEER_RELIABLE_WINDOWS;

			if (reliableWindow >= currentWindow && reliableWindow < currentWindow + ENET_PEER_FREE_RELIABLE_WINDOWS - 1)
				break;

			droppedCommand = enet_list_next(currentCommand);

			if (startCommand != currentCommand) {
				enet_list_move(enet_list_end(&peer->dispatchedCommands), startCommand, enet_list_previous(currentCommand));

				if (!peer->needsDispatch) {
					enet_list_insert(enet_list_end(&peer->host->dispatchQueue), &peer->dispatchList);

					peer->needsDispatch = 1;
				}
			}
		}

		startCommand = enet_list_next(currentCommand);
	}

	if (startCommand != currentCommand) {
		enet_list_move(enet_list_end(&peer->dispatchedCommands), startCommand, enet_list_previous(currentCommand));

		if (!peer->needsDispatch) {
			enet_list_insert(enet_list_end(&peer->host->dispatchQueue), &peer->dispatchList);

			peer->needsDispatch = 1;
		}

		droppedCommand = currentCommand;
	}

	enet_peer_remove_incoming_commands(&channel->incomingUnreliableCommands, enet_list_begin(&channel->incomingUnreliableCommands), droppedCommand, queuedCommand);
}